

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

termline * decompressline(compressed_scrollback_line *line)

{
  byte bVar1;
  byte bVar2;
  termline *ldata;
  termchar *ptVar3;
  ulong uVar4;
  byte bVar5;
  wchar_t wVar6;
  uint uVar7;
  long lVar8;
  BinarySource bs [1];
  
  bs[0].binarysource_ = bs;
  bs[0].len = line->len;
  bs[0].data = line + 1;
  bs[0].pos = 0;
  bs[0].err = BSE_NO_ERROR;
  bVar5 = 0;
  wVar6 = L'\0';
  do {
    bVar1 = BinarySource_get_byte(bs[0].binarysource_);
    bVar2 = bVar5 & 0x1f;
    wVar6 = wVar6 | (uint)(bVar1 & 0x7f) << bVar2;
    bVar5 = bVar5 + 7;
  } while ((char)bVar1 < '\0');
  lVar8 = 0;
  ldata = (termline *)safemalloc(1,0x28,(ulong)(uint)(0 << bVar2));
  ptVar3 = (termchar *)safemalloc((long)wVar6,0x20,0);
  ldata->chars = ptVar3;
  ldata->size = wVar6;
  ldata->cols = wVar6;
  ldata->temporary = true;
  ldata->cc_free = L'\0';
  uVar4 = 0;
  if (L'\0' < wVar6) {
    uVar4 = (ulong)(uint)wVar6;
  }
  for (; uVar4 * 0x20 != lVar8; lVar8 = lVar8 + 0x20) {
    *(undefined4 *)((long)&ptVar3->cc_next + lVar8) = 0;
  }
  bVar5 = 0;
  uVar7 = 0;
  do {
    bVar2 = BinarySource_get_byte(bs[0].binarysource_);
    uVar7 = uVar7 | (uint)(bVar2 & 0x7f) << (bVar5 & 0x1f);
    bVar5 = bVar5 + 7;
  } while ((char)bVar2 < '\0');
  ldata->lattr = (unsigned_short)uVar7;
  ldata->trusted = (_Bool)((byte)(uVar7 >> 0x10) & 1);
  readrle(bs,ldata,readliteral_chr);
  readrle(bs,ldata,readliteral_attr);
  readrle(bs,ldata,readliteral_truecolour);
  readrle(bs,ldata,readliteral_cc);
  if ((bs[0].binarysource_)->err == BSE_NO_ERROR) {
    if ((bs[0].binarysource_)->len == (bs[0].binarysource_)->pos) {
      return ldata;
    }
    __assert_fail("get_avail(bs) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x3da,"termline *decompressline(compressed_scrollback_line *)");
  }
  __assert_fail("!get_err(bs)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                ,0x3d9,"termline *decompressline(compressed_scrollback_line *)");
}

Assistant:

static termline *decompressline(compressed_scrollback_line *line)
{
    int ncols, byte, shift;
    BinarySource bs[1];
    termline *ldata;

    BinarySource_BARE_INIT(bs, line+1, line->len);

    /*
     * First read in the column count.
     */
    ncols = shift = 0;
    do {
        byte = get_byte(bs);
        ncols |= (byte & 0x7F) << shift;
        shift += 7;
    } while (byte & 0x80);

    /*
     * Now create the output termline.
     */
    ldata = snew(termline);
    ldata->chars = snewn(ncols, termchar);
    ldata->cols = ldata->size = ncols;
    ldata->temporary = true;
    ldata->cc_free = 0;

    /*
     * We must set all the cc pointers in ldata->chars to 0 right
     * now, so that cc diagnostics that verify the integrity of the
     * whole line will make sense while we're in the middle of
     * building it up.
     */
    {
        int i;
        for (i = 0; i < ldata->cols; i++)
            ldata->chars[i].cc_next = 0;
    }

    /*
     * Now read in the lattr.
     */
    int lattr = shift = 0;
    do {
        byte = get_byte(bs);
        lattr |= (byte & 0x7F) << shift;
        shift += 7;
    } while (byte & 0x80);
    ldata->lattr = lattr & 0xFFFF;
    ldata->trusted = (lattr & 0x10000) != 0;

    /*
     * Now we read in each of the RLE streams in turn.
     */
    readrle(bs, ldata, readliteral_chr);
    readrle(bs, ldata, readliteral_attr);
    readrle(bs, ldata, readliteral_truecolour);
    readrle(bs, ldata, readliteral_cc);

    /* And we always expect that we ended up exactly at the end of the
     * compressed data. */
    assert(!get_err(bs));
    assert(get_avail(bs) == 0);

    return ldata;
}